

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O3

lzma_match *
hc_find_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
            uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size,lzma_match *matches,
            uint32_t len_best)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint8_t *puVar7;
  lzma_match *local_40;
  
  local_40 = matches;
  son[cyclic_pos] = cur_match;
  uVar1 = pos - cur_match;
  if (cyclic_size <= uVar1 || depth == 0) {
    return matches;
  }
  do {
    puVar7 = cur + -(ulong)uVar1;
    uVar6 = 0;
    if (cyclic_pos < uVar1) {
      uVar6 = cyclic_size;
    }
    uVar6 = son[(cyclic_pos - uVar1) + uVar6];
    if ((puVar7[len_best] == cur[len_best]) && (*puVar7 == *cur)) {
      uVar3 = 1;
      uVar4 = 0;
      do {
        if (uVar3 - (len_limit - 1) == 1) {
          uVar4 = len_limit;
          uVar5 = (uint32_t)uVar3;
          break;
        }
        uVar2 = uVar3 & 0xffffffff;
        uVar3 = uVar3 + 1;
        uVar4 = uVar4 + 1;
        uVar5 = uVar4;
      } while (puVar7[uVar2] == cur[uVar2]);
      if (len_best < uVar4) {
        local_40->len = uVar4;
        local_40->dist = uVar1 - 1;
        local_40 = local_40 + 1;
        len_best = uVar4;
        if (uVar5 == len_limit) {
          return local_40;
        }
      }
    }
    depth = depth - 1;
    if (depth == 0) {
      return local_40;
    }
    uVar1 = pos - uVar6;
    if (cyclic_size <= uVar1) {
      return local_40;
    }
  } while( true );
}

Assistant:

static lzma_match *
hc_find_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size,
		lzma_match *matches,
		uint32_t len_best)
{
	son[cyclic_pos] = cur_match;

	while (true) {
		const uint32_t delta = pos - cur_match;
		const uint8_t *pb;
		if (depth-- == 0 || delta >= cyclic_size)
			return matches;

		pb = cur - delta;
		cur_match = son[cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0)];

		if (pb[len_best] == cur[len_best] && pb[0] == cur[0]) {
			uint32_t len = 0;
			while (++len != len_limit)
				if (pb[len] != cur[len])
					break;

			if (len_best < len) {
				len_best = len;
				matches->len = len;
				matches->dist = delta - 1;
				++matches;

				if (len == len_limit)
					return matches;
			}
		}
	}
}